

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall c4::yml::Tree::add_tag_directive(Tree *this,TagDirective *td)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  ro_substr chars;
  error_flags eVar7;
  int iVar8;
  size_t sVar9;
  basic_substring<const_char> *in_RSI;
  Tree *in_RDI;
  bool bVar10;
  char msg_5 [44];
  size_t pos;
  char msg_4 [166];
  char msg_3 [41];
  char msg_2 [43];
  char msg_1 [33];
  char msg [33];
  size_t in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc68;
  char in_stack_fffffffffffffc6f;
  undefined7 in_stack_fffffffffffffc70;
  char in_stack_fffffffffffffc77;
  basic_substring<const_char> *in_stack_fffffffffffffc78;
  Location *in_stack_fffffffffffffc80;
  Location *this_00;
  size_t in_stack_fffffffffffffc90;
  char *pcVar11;
  basic_substring<const_char> *in_stack_fffffffffffffc98;
  pfn_error p_Var12;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 uVar13;
  char *in_stack_fffffffffffffca8;
  char *in_stack_fffffffffffffcc8;
  pfn_error in_stack_fffffffffffffcd0;
  basic_substring<const_char> *this_01;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  size_t local_2d0;
  Location local_2c8;
  size_t local_298;
  undefined8 local_290;
  size_t sStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  basic_substring<const_char> *local_270;
  char local_268 [168];
  basic_substring<char_const> local_1c0 [16];
  basic_substring<const_char> local_1b0;
  undefined8 local_1a0;
  size_t sStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  basic_substring<const_char> *local_180;
  char local_178 [56];
  undefined8 local_140;
  size_t sStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  basic_substring<const_char> *local_120;
  char local_118 [56];
  undefined8 local_e0;
  size_t sStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  basic_substring<const_char> *local_c0;
  char local_b8 [40];
  undefined8 local_90;
  size_t sStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  basic_substring<const_char> *local_70;
  char local_68 [40];
  basic_substring<const_char> *local_40;
  basic_substring<const_char> *local_30;
  char *local_20;
  basic_substring<const_char> *local_18;
  undefined1 local_9;
  basic_substring<const_char> *local_8;
  
  bVar10 = true;
  if (in_RSI->len != 0) {
    bVar10 = in_RSI->str == (char *)0x0;
  }
  local_40 = in_RSI;
  if (bVar10) {
    memcpy(local_68,"check failed: !td.handle.empty()",0x21);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_callbacks).m_error;
    Location::Location(in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                       CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                       CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
                       in_stack_fffffffffffffc60);
    in_stack_fffffffffffffc68 = (undefined7)local_80;
    in_stack_fffffffffffffc6f = (char)((ulong)local_80 >> 0x38);
    in_stack_fffffffffffffc70 = (undefined7)uStack_78;
    in_stack_fffffffffffffc77 = (char)((ulong)uStack_78 >> 0x38);
    LVar1.super_LineCol.line = sStack_88;
    LVar1.super_LineCol.offset = local_90;
    LVar1.super_LineCol.col._0_7_ = in_stack_fffffffffffffc68;
    LVar1.super_LineCol.col._7_1_ = in_stack_fffffffffffffc6f;
    LVar1.name.str._0_7_ = in_stack_fffffffffffffc70;
    LVar1.name.str._7_1_ = in_stack_fffffffffffffc77;
    LVar1.name.len = (size_t)local_70;
    (*p_Var12)(local_68,0x21,LVar1,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffc60 = sStack_88;
    in_stack_fffffffffffffc78 = local_70;
  }
  this_01 = local_40 + 1;
  bVar10 = true;
  if (local_40[1].len != 0) {
    bVar10 = this_01->str == (char *)0x0;
  }
  local_30 = this_01;
  if (bVar10) {
    memcpy(local_b8,"check failed: !td.prefix.empty()",0x21);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    in_stack_fffffffffffffcd0 = (in_RDI->m_callbacks).m_error;
    in_stack_fffffffffffffcc8 = local_b8;
    Location::Location(in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                       CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                       CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
                       in_stack_fffffffffffffc60);
    in_stack_fffffffffffffc68 = (undefined7)local_d0;
    in_stack_fffffffffffffc6f = (char)((ulong)local_d0 >> 0x38);
    in_stack_fffffffffffffc70 = (undefined7)uStack_c8;
    in_stack_fffffffffffffc77 = (char)((ulong)uStack_c8 >> 0x38);
    LVar2.super_LineCol.line = sStack_d8;
    LVar2.super_LineCol.offset = local_e0;
    LVar2.super_LineCol.col._0_7_ = in_stack_fffffffffffffc68;
    LVar2.super_LineCol.col._7_1_ = in_stack_fffffffffffffc6f;
    LVar2.name.str._0_7_ = in_stack_fffffffffffffc70;
    LVar2.name.str._7_1_ = in_stack_fffffffffffffc77;
    LVar2.name.len = (size_t)local_c0;
    (*in_stack_fffffffffffffcd0)
              (in_stack_fffffffffffffcc8,0x21,LVar2,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffc60 = sStack_d8;
    in_stack_fffffffffffffc78 = local_c0;
  }
  bVar10 = basic_substring<const_char>::begins_with(local_40,'!');
  if (!bVar10) {
    memcpy(local_118,"check failed: (td.handle.begins_with(\'!\'))",0x2b);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_callbacks).m_error;
    Location::Location(in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                       CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                       CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
                       in_stack_fffffffffffffc60);
    in_stack_fffffffffffffc68 = (undefined7)local_130;
    in_stack_fffffffffffffc6f = (char)((ulong)local_130 >> 0x38);
    in_stack_fffffffffffffc70 = (undefined7)uStack_128;
    in_stack_fffffffffffffc77 = (char)((ulong)uStack_128 >> 0x38);
    LVar3.super_LineCol.line = sStack_138;
    LVar3.super_LineCol.offset = local_140;
    LVar3.super_LineCol.col._0_7_ = in_stack_fffffffffffffc68;
    LVar3.super_LineCol.col._7_1_ = in_stack_fffffffffffffc6f;
    LVar3.name.str._0_7_ = in_stack_fffffffffffffc70;
    LVar3.name.str._7_1_ = in_stack_fffffffffffffc77;
    LVar3.name.len = (size_t)local_120;
    (*p_Var12)(local_118,0x2b,LVar3,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffc60 = sStack_138;
    in_stack_fffffffffffffc78 = local_120;
  }
  bVar10 = basic_substring<const_char>::ends_with(local_40,'!');
  if (!bVar10) {
    memcpy(local_178,"check failed: (td.handle.ends_with(\'!\'))",0x29);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_callbacks).m_error;
    in_stack_fffffffffffffca8 = local_178;
    Location::Location(in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                       CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                       CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
                       in_stack_fffffffffffffc60);
    in_stack_fffffffffffffc68 = (undefined7)local_190;
    in_stack_fffffffffffffc6f = (char)((ulong)local_190 >> 0x38);
    in_stack_fffffffffffffc70 = (undefined7)uStack_188;
    in_stack_fffffffffffffc77 = (char)((ulong)uStack_188 >> 0x38);
    LVar4.super_LineCol.line = sStack_198;
    LVar4.super_LineCol.offset = local_1a0;
    LVar4.super_LineCol.col._0_7_ = in_stack_fffffffffffffc68;
    LVar4.super_LineCol.col._7_1_ = in_stack_fffffffffffffc6f;
    LVar4.name.str._0_7_ = in_stack_fffffffffffffc70;
    LVar4.name.str._7_1_ = in_stack_fffffffffffffc77;
    LVar4.name.len = (size_t)local_180;
    (*p_Var12)(in_stack_fffffffffffffca8,0x29,LVar4,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffc60 = sStack_198;
    in_stack_fffffffffffffc78 = local_180;
  }
  local_8 = local_40;
  local_9 = 0x21;
  iVar8 = basic_substring<const_char>::compare(in_stack_fffffffffffffc78,in_stack_fffffffffffffc77);
  uVar13 = true;
  if (iVar8 != 0) {
    local_18 = local_40;
    local_20 = "!!";
    iVar8 = basic_substring<const_char>::compare
                      (this_01,(char *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8);
    uVar13 = true;
    if (iVar8 != 0) {
      local_1b0 = basic_substring<const_char>::trim
                            ((basic_substring<const_char> *)
                             CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                             in_stack_fffffffffffffc6f);
      basic_substring<char_const>::basic_substring<65ul>
                (local_1c0,
                 (char (*) [65])"01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-");
      chars.str._7_1_ = uVar13;
      chars.str._0_7_ = in_stack_fffffffffffffca0;
      chars.len = (size_t)in_stack_fffffffffffffca8;
      sVar9 = basic_substring<const_char>::first_not_of
                        (in_stack_fffffffffffffc98,chars,in_stack_fffffffffffffc90);
      uVar13 = sVar9 == 0xffffffffffffffff;
    }
  }
  if (((uVar13 ^ 0xff) & 1) != 0) {
    memcpy(local_268,
           "check failed: (td.handle == \'!\' || td.handle == \"!!\" || td.handle.trim(\'!\').first_not_of(\"01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-\") == npos)"
           ,0xa6);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_callbacks).m_error;
    pcVar11 = local_268;
    Location::Location(in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                       CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                       CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
                       in_stack_fffffffffffffc60);
    in_stack_fffffffffffffc68 = (undefined7)local_280;
    in_stack_fffffffffffffc6f = (char)((ulong)local_280 >> 0x38);
    in_stack_fffffffffffffc70 = (undefined7)uStack_278;
    in_stack_fffffffffffffc77 = (char)((ulong)uStack_278 >> 0x38);
    LVar5.super_LineCol.line = sStack_288;
    LVar5.super_LineCol.offset = local_290;
    LVar5.super_LineCol.col._0_7_ = in_stack_fffffffffffffc68;
    LVar5.super_LineCol.col._7_1_ = in_stack_fffffffffffffc6f;
    LVar5.name.str._0_7_ = in_stack_fffffffffffffc70;
    LVar5.name.str._7_1_ = in_stack_fffffffffffffc77;
    LVar5.name.len = (size_t)local_270;
    (*p_Var12)(pcVar11,0xa6,LVar5,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffffc60 = sStack_288;
    in_stack_fffffffffffffc78 = local_270;
  }
  local_298 = num_tag_directives(in_RDI);
  if (3 < local_298) {
    memcpy(&local_2c8,"check failed: pos < RYML_MAX_TAG_DIRECTIVES",0x2c);
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var12 = (in_RDI->m_callbacks).m_error;
    this_00 = &local_2c8;
    Location::Location(this_00,(char *)in_stack_fffffffffffffc78,
                       CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                       CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
                       in_stack_fffffffffffffc60);
    LVar6.super_LineCol.line = uStack_2e8;
    LVar6.super_LineCol.offset = local_2f0;
    LVar6.super_LineCol.col._0_7_ = (int7)local_2e0;
    LVar6.super_LineCol.col._7_1_ = (char)((ulong)local_2e0 >> 0x38);
    LVar6.name.str._0_7_ = (int7)uStack_2d8;
    LVar6.name.str._7_1_ = (char)((ulong)uStack_2d8 >> 0x38);
    LVar6.name.len = local_2d0;
    (*p_Var12)((char *)this_00,0x2c,LVar6,(in_RDI->m_callbacks).m_user_data);
  }
  memcpy(in_RDI->m_tag_directives + local_298,local_40,0x28);
  return local_298;
}

Assistant:

size_t Tree::add_tag_directive(TagDirective const& td)
{
    _RYML_CB_CHECK(m_callbacks, !td.handle.empty());
    _RYML_CB_CHECK(m_callbacks, !td.prefix.empty());
    _RYML_CB_ASSERT(m_callbacks, td.handle.begins_with('!'));
    _RYML_CB_ASSERT(m_callbacks, td.handle.ends_with('!'));
    // https://yaml.org/spec/1.2.2/#rule-ns-word-char
    _RYML_CB_ASSERT(m_callbacks, td.handle == '!' || td.handle == "!!" || td.handle.trim('!').first_not_of("01234567890abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ-") == npos);
    size_t pos = num_tag_directives();
    _RYML_CB_CHECK(m_callbacks, pos < RYML_MAX_TAG_DIRECTIVES);
    m_tag_directives[pos] = td;
    return pos;
}